

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea.c
# Opt level: O3

void CVApolynomialFree(CVodeMem cv_mem)

{
  CVadjMemRec *pCVar1;
  CVdtpntMemRec **ppCVar2;
  undefined8 *puVar3;
  long lVar4;
  
  pCVar1 = cv_mem->cv_adj_mem;
  N_VDestroy(pCVar1->ca_ytmp);
  if (pCVar1->ca_IMstoreSensi != 0) {
    N_VDestroyVectorArray(pCVar1->ca_yStmp,cv_mem->cv_Ns);
  }
  if (-1 < pCVar1->ca_nsteps) {
    ppCVar2 = pCVar1->dt_mem;
    lVar4 = -1;
    do {
      puVar3 = (undefined8 *)ppCVar2[lVar4 + 1]->content;
      N_VDestroy(*puVar3);
      if (pCVar1->ca_IMstoreSensi != 0) {
        N_VDestroyVectorArray(puVar3[1],cv_mem->cv_Ns);
      }
      free(ppCVar2[lVar4 + 1]->content);
      ppCVar2[lVar4 + 1]->content = (void *)0x0;
      lVar4 = lVar4 + 1;
    } while (lVar4 < pCVar1->ca_nsteps);
  }
  return;
}

Assistant:

static void CVApolynomialFree(CVodeMem cv_mem)
{
  CVadjMem ca_mem;
  CVdtpntMem* dt_mem;
  CVpolynomialDataMem content;
  long int i;

  ca_mem = cv_mem->cv_adj_mem;

  N_VDestroy(ca_mem->ca_ytmp);

  if (ca_mem->ca_IMstoreSensi)
  {
    N_VDestroyVectorArray(ca_mem->ca_yStmp, cv_mem->cv_Ns);
  }

  dt_mem = ca_mem->dt_mem;

  for (i = 0; i <= ca_mem->ca_nsteps; i++)
  {
    content = (CVpolynomialDataMem)(dt_mem[i]->content);
    N_VDestroy(content->y);
    if (ca_mem->ca_IMstoreSensi)
    {
      N_VDestroyVectorArray(content->yS, cv_mem->cv_Ns);
    }
    free(dt_mem[i]->content);
    dt_mem[i]->content = NULL;
  }
}